

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

shared_ptr<Handler> __thiscall
GameEngine::generateBotHandlersChain(GameEngine *this,shared_ptr<Player> *bot)

{
  Player *this_00;
  CellType *pCVar1;
  element_type *peVar2;
  Handler *this_01;
  element_type *peVar3;
  undefined8 this_02;
  element_type *this_03;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  int32_t iVar7;
  TypeName TVar8;
  ParamType size;
  int32_t iVar9;
  size_t sVar10;
  ulong uVar11;
  RandomGenerator *pRVar12;
  Config *this_04;
  pair<int,_int> pVar13;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar14;
  int iVar15;
  undefined8 *in_RDX;
  ulong uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_05;
  uint uVar17;
  uint uVar18;
  size_t index;
  shared_ptr<Handler> sVar19;
  shared_ptr<Handler> link;
  undefined1 local_158 [16];
  shared_ptr<Population> newPopulation;
  long local_138;
  shared_ptr<Population> local_128;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> chain;
  __shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<MoveHandler,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  chain.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chain.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chain.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar10 = Player::getPopulationsNumber((Player *)*in_RDX);
  local_138 = 0;
  uVar11 = sVar10 & 0xffffffff;
  if ((int)sVar10 < 1) {
    uVar11 = 0;
  }
  uVar16 = 0;
  do {
    if (uVar11 == uVar16) {
      std::__shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &(chain.
                   super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>);
      std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::~vector
                (&chain);
      sVar19.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar19.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<Handler>)sVar19.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>;
    }
    Player::getPopulation((Player *)&link,(int32_t)*in_RDX);
    local_158._0_8_ = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158._8_8_ = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar4 = Population::GetXPos((Population *)local_158._0_8_);
    iVar5 = Population::GetYPos((Population *)local_158._0_8_);
    pRVar12 = RandomGenerator::getInstance();
    iVar6 = RandomGenerator::randInt(pRVar12,1,2);
    iVar7 = Population::GetAnimalAmount((Population *)local_158._0_8_);
    this_04 = Config::getInstance();
    TVar8 = Population::GetType((Population *)local_158._0_8_);
    size = Population::GetSize((Population *)local_158._0_8_);
    iVar9 = Config::getMaxAmount(this_04,TVar8,size);
    iVar15 = iVar7 * 10;
    if (iVar15 != iVar9 * 9 && SBORROW4(iVar15,iVar9 * 9) == iVar15 + iVar9 * -9 < 0) {
      iVar6 = 3;
    }
    if (iVar6 == 1) {
      pRVar12 = RandomGenerator::getInstance();
      iVar4 = RandomGenerator::randInt(pRVar12,0,3);
      switch(iVar4) {
      case 0:
        std::make_shared<CoverMutationHandler>();
        std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                   (__shared_ptr<CoverMutationHandler,_(__gnu_cxx::_Lock_policy)2> *)&newPopulation)
        ;
        break;
      case 1:
        std::make_shared<SafetyMutationHandler>();
        std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                   (__shared_ptr<SafetyMutationHandler,_(__gnu_cxx::_Lock_policy)2> *)&newPopulation
                  );
        break;
      case 2:
        std::make_shared<SizeMutationHandler>();
        std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                   (__shared_ptr<SizeMutationHandler,_(__gnu_cxx::_Lock_policy)2> *)&newPopulation);
        break;
      case 3:
        std::make_shared<VelocityMutationHandler>();
        std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                   (__shared_ptr<VelocityMutationHandler,_(__gnu_cxx::_Lock_policy)2> *)
                   &newPopulation);
        break;
      default:
        goto switchD_00135ac8_default;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
switchD_00135ac8_default:
      peVar3 = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
      Handler::setPopulation(peVar3,(shared_ptr<Population> *)&local_50);
      this_05 = &local_50._M_refcount;
LAB_00135d30:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_05);
    }
    else {
      if (iVar6 != 2) {
        if (iVar6 != 3) goto LAB_00135d35;
        std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
        pVar13 = getDestinationPos((GameEngine *)bot,(shared_ptr<Population> *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        if ((ulong)pVar13 >> 0x20 == 0 && pVar13.first == 0) {
          std::make_shared<VelocityMutationHandler>();
          std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                     (__shared_ptr<VelocityMutationHandler,_(__gnu_cxx::_Lock_policy)2> *)
                     &newPopulation);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar3 = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a0,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
          Handler::setPopulation(peVar3,(shared_ptr<Population> *)&local_a0);
          this_05 = &local_a0._M_refcount;
        }
        else {
          std::make_shared<Population,Population&>((Population *)&newPopulation);
          this_03 = newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar7 = Population::GetAnimalAmount
                            (newPopulation.
                             super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Population::SetAnimalAmount(this_03,iVar7 / 2);
          this_02 = local_158._0_8_;
          iVar7 = Population::GetAnimalAmount((Population *)local_158._0_8_);
          Population::SetAnimalAmount((Population *)this_02,iVar7 / 2);
          std::make_shared<MoveHandler>();
          std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          uVar17 = iVar4 + pVar13.first;
          uVar18 = iVar5 + pVar13.second;
          (**(link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Handler)
                    (link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ulong)uVar17,(ulong)uVar18);
          peVar3 = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_b0,
                     &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
          Handler::setPopulation(peVar3,(shared_ptr<Population> *)&local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          this_00 = (Player *)*in_RDX;
          std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c0,
                     &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
          Player::addNewPopulation(this_00,(shared_ptr<Population> *)&local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
          sVar10 = (size_t)(int)uVar18;
          pvVar14 = Map::operator[]((Map *)(bot->
                                           super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>).
                                           _M_ptr,sVar10);
          pCVar1 = (pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_d0,
                     &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
          CellType::setCurrentPopulation(pCVar1,(shared_ptr<Population> *)&local_d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
          TVar8 = Population::GetType((Population *)local_158._0_8_);
          peVar2 = (bot->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (TVar8 == HERBIVORE) {
            pvVar14 = Map::operator[]((Map *)peVar2,sVar10);
            CellType::setHerbivoreCount
                      ((pvVar14->
                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                       super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
          }
          else {
            pvVar14 = Map::operator[]((Map *)peVar2,sVar10);
            CellType::setCarnivoreCount
                      ((pvVar14->
                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                       super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
          }
          this_05 = &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
        }
        goto LAB_00135d30;
      }
      std::make_shared<MoveHandler>();
      std::__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Handler,(__gnu_cxx::_Lock_policy)2> *)&link,
                 (__shared_ptr<MoveHandler,_(__gnu_cxx::_Lock_policy)2> *)&newPopulation);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
      pVar13 = getDestinationPos((GameEngine *)bot,(shared_ptr<Population> *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      uVar18 = iVar4 + pVar13.first;
      uVar17 = pVar13.second + iVar5;
      (**(link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Handler)
                (link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(ulong)uVar18,
                 (ulong)uVar17);
      peVar3 = link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
      Handler::setPopulation(peVar3,(shared_ptr<Population> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      index = (size_t)iVar5;
      pvVar14 = Map::operator[]((Map *)(bot->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)
                                       ._M_ptr,index);
      local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      CellType::setCurrentPopulation
                ((pvVar14->
                 super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[iVar4].
                 super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      sVar10 = (size_t)(int)uVar17;
      pvVar14 = Map::operator[]((Map *)(bot->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)
                                       ._M_ptr,sVar10);
      pCVar1 = (pvVar14->
               super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
               super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,(__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)local_158);
      CellType::setCurrentPopulation(pCVar1,(shared_ptr<Population> *)&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      TVar8 = Population::GetType((Population *)local_158._0_8_);
      peVar2 = (bot->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (TVar8 == HERBIVORE) {
        pvVar14 = Map::operator[]((Map *)peVar2,index);
        CellType::setHerbivoreCount
                  ((pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[iVar4].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
        pvVar14 = Map::operator[]((Map *)(bot->
                                         super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr,sVar10);
        CellType::setHerbivoreCount
                  ((pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
      }
      else {
        pvVar14 = Map::operator[]((Map *)peVar2,index);
        CellType::setCarnivoreCount
                  ((pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[iVar4].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
        pvVar14 = Map::operator[]((Map *)(bot->
                                         super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr,sVar10);
        CellType::setCarnivoreCount
                  ((pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[(int)uVar18].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
      }
    }
LAB_00135d35:
    std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::push_back
              (&chain,&link);
    if (local_138 != 0) {
      this_01 = *(Handler **)
                 ((long)&chain.
                         super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].
                         super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr + local_138)
      ;
      std::__shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,
                 (__shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((chain.
                           super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + local_138
                 ));
      Handler::setNext(this_01,(shared_ptr<Handler> *)&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    uVar16 = uVar16 + 1;
    local_138 = local_138 + 0x10;
  } while( true );
}

Assistant:

std::shared_ptr<Handler> GameEngine::generateBotHandlersChain(std::shared_ptr<Player> bot) {
  std::vector<std::shared_ptr<Handler> > chain;
  int32_t populationAmount = bot->getPopulationsNumber();
  for (int32_t i = 0; i < populationAmount; ++i) {
    std::shared_ptr<Population> tempPopulation = std::move(bot->getPopulation(i));
    std::shared_ptr<Handler> link;
    int32_t x = tempPopulation->GetXPos();
    int32_t y = tempPopulation->GetYPos();
    int32_t dX, dY;
    std::pair<int32_t, int32_t> pos;
    int32_t mutationType;
    int32_t handlerType = RandomGenerator::getInstance().randInt(1, 2);
    if (tempPopulation->GetAnimalAmount() * 10
        > Config::getInstance().getMaxAmount(tempPopulation->GetType(), tempPopulation->GetSize()) * 9) {
    handlerType = 3;
    }
    switch (handlerType) {
      case 1:mutationType = RandomGenerator::getInstance().randInt(0, 3);
        switch (mutationType) {
          case 0:link = std::make_shared<CoverMutationHandler>();
            break;
          case 1:link = std::make_shared<SafetyMutationHandler>();
            break;
          case 2:link = std::make_shared<SizeMutationHandler>();
            break;
          case 3:link = std::make_shared<VelocityMutationHandler>();
            break;
        }
        link->setPopulation(tempPopulation);
        break;
      case 2:link = std::make_shared<MoveHandler>();
        pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        link->setXYPos(x + dX, y + dY);
        link->setPopulation(tempPopulation);
        (*map)[y][x]->setCurrentPopulation(nullptr);
        (*map)[y + dY][x + dX]->setCurrentPopulation(tempPopulation);
        if (tempPopulation->GetType() == Population::HERBIVORE) {
          (*map)[y][x]->setHerbivoreCount(0);
          (*map)[y + dY][x + dX]->setHerbivoreCount(1);
        } else {
          (*map)[y][x]->setCarnivoreCount(0);
          (*map)[y + dY][x + dX]->setCarnivoreCount(1);
        }
        break;
      case 3:pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        if (dX == 0 && dY == 0) {
          link = std::make_shared<VelocityMutationHandler>();
          link->setPopulation(tempPopulation);
        } else {
          std::shared_ptr<Population> newPopulation = std::make_shared<Population>(*(tempPopulation));
          newPopulation->SetAnimalAmount(newPopulation->GetAnimalAmount() / 2);
          tempPopulation->SetAnimalAmount(tempPopulation->GetAnimalAmount() / 2);
          link = std::make_shared<MoveHandler>();
          link->setXYPos(x + dX, y + dY);
          link->setPopulation(newPopulation);
          bot->addNewPopulation(newPopulation);
          (*map)[y + dY][x + dX]->setCurrentPopulation(newPopulation);
          if (tempPopulation->GetType() == Population::HERBIVORE) {
            (*map)[y + dY][x + dX]->setHerbivoreCount(1);
          } else {
            (*map)[y + dY][x + dX]->setCarnivoreCount(1);
          }
        }
        break;
    }
    chain.push_back(link);
    if (i > 0) {
      chain[i - 1]->setNext(chain[i]);
    }
  }
  return chain[0];
}